

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportSet.cxx
# Opt level: O1

void __thiscall cmExportSet::~cmExportSet(cmExportSet *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppcVar2;
  pointer pcVar3;
  
  ppcVar2 = (this->Installations).
            super__Vector_base<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppcVar2 != (pointer)0x0) {
    operator_delete(ppcVar2,(long)(this->Installations).
                                  super__Vector_base<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar2
                   );
  }
  pcVar3 = (this->Name)._M_dataplus._M_p;
  paVar1 = &(this->Name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  std::
  vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
  ::~vector(&this->TargetExports);
  return;
}

Assistant:

cmExportSet::~cmExportSet() = default;